

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.h
# Opt level: O0

void __thiscall server::captureservmode::baseinfo::reset(baseinfo *this)

{
  baseinfo *this_local;
  
  noenemy(this);
  this->owner[0] = '\0';
  this->capturetime = -1;
  this->ammogroup = 0;
  this->ammotype = 0;
  this->tag = -1;
  this->ammo = 0;
  this->owners = 0;
  return;
}

Assistant:

void reset()
        {
            noenemy();
            owner[0] = '\0';
            capturetime = -1;
            ammogroup = 0;
            ammotype = 0;
            tag = -1;
            ammo = 0;
            owners = 0;
        }